

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonObjectFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  byte *pbVar1;
  Mem *pMVar2;
  u32 N;
  uchar *zIn;
  long lVar3;
  JsonString jx;
  
  if ((argc & 1U) != 0) {
    sqlite3_result_error(ctx,"json_object() requires an even number of arguments",-1);
    return;
  }
  jx.zBuf = jx.zSpace;
  jx.nAlloc = 100;
  jx.nUsed = 0;
  jx.bStatic = '\x01';
  jx.bErr = '\0';
  jx.pCtx = ctx;
  jsonAppendChar(&jx,'{');
  lVar3 = 0;
  while( true ) {
    if (argc <= lVar3) {
      jsonAppendChar(&jx,'}');
      jsonResult(&jx);
      pMVar2 = ctx->pOut;
      pMVar2->eSubtype = 'J';
      pbVar1 = (byte *)((long)&pMVar2->flags + 1);
      *pbVar1 = *pbVar1 | 0x80;
      return;
    }
    if ((argv[lVar3]->flags & 0xf) != 2) break;
    jsonAppendSeparator(&jx);
    zIn = sqlite3_value_text(argv[lVar3]);
    N = sqlite3_value_bytes(argv[lVar3]);
    jsonAppendString(&jx,(char *)zIn,N);
    jsonAppendChar(&jx,':');
    jsonAppendValue(&jx,argv[lVar3 + 1]);
    lVar3 = lVar3 + 2;
  }
  sqlite3_result_error(ctx,"json_object() labels must be TEXT",-1);
  jsonReset(&jx);
  return;
}

Assistant:

static void jsonObjectFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  int i;
  JsonString jx;
  const char *z;
  u32 n;

  if( argc&1 ){
    sqlite3_result_error(ctx, "json_object() requires an even number "
                                  "of arguments", -1);
    return;
  }
  jsonInit(&jx, ctx);
  jsonAppendChar(&jx, '{');
  for(i=0; i<argc; i+=2){
    if( sqlite3_value_type(argv[i])!=SQLITE_TEXT ){
      sqlite3_result_error(ctx, "json_object() labels must be TEXT", -1);
      jsonReset(&jx);
      return;
    }
    jsonAppendSeparator(&jx);
    z = (const char*)sqlite3_value_text(argv[i]);
    n = (u32)sqlite3_value_bytes(argv[i]);
    jsonAppendString(&jx, z, n);
    jsonAppendChar(&jx, ':');
    jsonAppendValue(&jx, argv[i+1]);
  }
  jsonAppendChar(&jx, '}');
  jsonResult(&jx);
  sqlite3_result_subtype(ctx, JSON_SUBTYPE);
}